

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS
ref_mpi_blindsend(REF_MPI ref_mpi,REF_INT *proc,void *send,REF_INT ldim,REF_INT nsend,void **recv,
                 REF_INT *nrecv,REF_TYPE type)

{
  uint uVar1;
  void *pvVar2;
  REF_INT *send_size;
  REF_INT *recv_size;
  undefined4 *__ptr;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  void *a_data;
  REF_INT b_total;
  REF_INT a_total;
  REF_INT *a_next;
  REF_INT *b_size;
  REF_INT *a_size;
  int local_40;
  REF_INT part;
  REF_INT l;
  REF_INT i;
  void **recv_local;
  REF_INT nsend_local;
  REF_INT ldim_local;
  void *send_local;
  REF_INT *proc_local;
  REF_MPI ref_mpi_local;
  
  *recv = (void *)0x0;
  if (ref_mpi->n < 2) {
    *nrecv = nsend;
    if (type == 1) {
      if (ldim * nsend < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x439
               ,"ref_mpi_blindsend","malloc *((REF_INT **)recv) of REF_INT negative");
        return 1;
      }
      pvVar2 = malloc((long)(ldim * nsend) << 2);
      *recv = pvVar2;
      if (*recv == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x439
               ,"ref_mpi_blindsend","malloc *((REF_INT **)recv) of REF_INT NULL");
        return 2;
      }
      for (part = 0; part < ldim * nsend; part = part + 1) {
        *(undefined4 *)((long)*recv + (long)part * 4) = *(undefined4 *)((long)send + (long)part * 4)
        ;
      }
    }
    else if (type == 2) {
      if (ldim * nsend < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x43f
               ,"ref_mpi_blindsend","malloc *((REF_LONG **)recv) of REF_LONG negative");
        return 1;
      }
      pvVar2 = malloc((long)(ldim * nsend) << 3);
      *recv = pvVar2;
      if (*recv == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x43f
               ,"ref_mpi_blindsend","malloc *((REF_LONG **)recv) of REF_LONG NULL");
        return 2;
      }
      for (part = 0; part < ldim * nsend; part = part + 1) {
        *(undefined8 *)((long)*recv + (long)part * 8) = *(undefined8 *)((long)send + (long)part * 8)
        ;
      }
    }
    else {
      if (type != 3) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",1099,
               "ref_mpi_blindsend",6,"data type");
        return 6;
      }
      if (ldim * nsend < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x445
               ,"ref_mpi_blindsend","malloc *((REF_DBL **)recv) of REF_DBL negative");
        return 1;
      }
      pvVar2 = malloc((long)(ldim * nsend) << 3);
      *recv = pvVar2;
      if (*recv == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x445
               ,"ref_mpi_blindsend","malloc *((REF_DBL **)recv) of REF_DBL NULL");
        return 2;
      }
      for (part = 0; part < ldim * nsend; part = part + 1) {
        *(undefined8 *)((long)*recv + (long)part * 8) = *(undefined8 *)((long)send + (long)part * 8)
        ;
      }
    }
    return 0;
  }
  if (ref_mpi->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x450,
           "ref_mpi_blindsend","malloc a_size of REF_INT negative");
    return 1;
  }
  send_size = (REF_INT *)malloc((long)ref_mpi->n << 2);
  if (send_size == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x450,
           "ref_mpi_blindsend","malloc a_size of REF_INT NULL");
    return 2;
  }
  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_mpi->n;
      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
    send_size[ref_private_macro_code_rss_1] = 0;
  }
  if (ref_mpi->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x451,
           "ref_mpi_blindsend","malloc b_size of REF_INT negative");
    return 1;
  }
  recv_size = (REF_INT *)malloc((long)ref_mpi->n << 2);
  if (recv_size == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x451,
           "ref_mpi_blindsend","malloc b_size of REF_INT NULL");
    return 2;
  }
  for (ref_private_macro_code_rss_2 = 0; ref_private_macro_code_rss_2 < ref_mpi->n;
      ref_private_macro_code_rss_2 = ref_private_macro_code_rss_2 + 1) {
    recv_size[ref_private_macro_code_rss_2] = 0;
  }
  for (part = 0; part < nsend; part = part + 1) {
    send_size[proc[part]] = send_size[proc[part]] + 1;
  }
  uVar1 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x456,
           "ref_mpi_blindsend",(ulong)uVar1,"alltoall sizes");
    return uVar1;
  }
  a_data._4_4_ = 0;
  for (a_size._4_4_ = 0; a_size._4_4_ < ref_mpi->n; a_size._4_4_ = a_size._4_4_ + 1) {
    a_data._4_4_ = send_size[a_size._4_4_] + a_data._4_4_;
  }
  a_data._0_4_ = 0;
  for (a_size._4_4_ = 0; a_size._4_4_ < ref_mpi->n; a_size._4_4_ = a_size._4_4_ + 1) {
    a_data._0_4_ = recv_size[a_size._4_4_] + (int)a_data;
  }
  if (ref_mpi->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x45e,
           "ref_mpi_blindsend","malloc a_next of REF_INT negative");
    return 1;
  }
  __ptr = (undefined4 *)malloc((long)ref_mpi->n << 2);
  if (__ptr == (undefined4 *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x45e,
           "ref_mpi_blindsend","malloc a_next of REF_INT NULL");
    return 2;
  }
  *__ptr = 0;
  for (a_size._4_4_ = 1; a_size._4_4_ < ref_mpi->n; a_size._4_4_ = a_size._4_4_ + 1) {
    __ptr[a_size._4_4_] = __ptr[a_size._4_4_ + -1] + send_size[a_size._4_4_ + -1];
  }
  *recv = (void *)0x0;
  if (type == 1) {
    if (ldim * a_data._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x467,
             "ref_mpi_blindsend","malloc a_data of REF_INT negative");
      return 1;
    }
    _ref_malloc_init_i = malloc((long)(ldim * a_data._4_4_) << 2);
    if (_ref_malloc_init_i == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x467,
             "ref_mpi_blindsend","malloc a_data of REF_INT NULL");
      return 2;
    }
    if (ldim * (int)a_data < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x468,
             "ref_mpi_blindsend","malloc *((REF_INT **)recv) of REF_INT negative");
      return 1;
    }
    pvVar2 = malloc((long)(ldim * (int)a_data) << 2);
    *recv = pvVar2;
    if (*recv == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x468,
             "ref_mpi_blindsend","malloc *((REF_INT **)recv) of REF_INT NULL");
      return 2;
    }
    for (part = 0; part < nsend; part = part + 1) {
      for (local_40 = 0; local_40 < ldim; local_40 = local_40 + 1) {
        *(undefined4 *)((long)_ref_malloc_init_i + (long)(local_40 + ldim * __ptr[proc[part]]) * 4)
             = *(undefined4 *)((long)send + (long)(local_40 + ldim * part) * 4);
      }
      __ptr[proc[part]] = __ptr[proc[part]] + 1;
    }
  }
  else if (type == 2) {
    if (ldim * a_data._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x471,
             "ref_mpi_blindsend","malloc a_data of REF_LONG negative");
      return 1;
    }
    _ref_malloc_init_i = malloc((long)(ldim * a_data._4_4_) << 3);
    if (_ref_malloc_init_i == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x471,
             "ref_mpi_blindsend","malloc a_data of REF_LONG NULL");
      return 2;
    }
    if (ldim * (int)a_data < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x472,
             "ref_mpi_blindsend","malloc *((REF_LONG **)recv) of REF_LONG negative");
      return 1;
    }
    pvVar2 = malloc((long)(ldim * (int)a_data) << 3);
    *recv = pvVar2;
    if (*recv == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x472,
             "ref_mpi_blindsend","malloc *((REF_LONG **)recv) of REF_LONG NULL");
      return 2;
    }
    for (part = 0; part < nsend; part = part + 1) {
      for (local_40 = 0; local_40 < ldim; local_40 = local_40 + 1) {
        *(undefined8 *)((long)_ref_malloc_init_i + (long)(local_40 + ldim * __ptr[proc[part]]) * 8)
             = *(undefined8 *)((long)send + (long)(local_40 + ldim * part) * 8);
      }
      __ptr[proc[part]] = __ptr[proc[part]] + 1;
    }
  }
  else {
    if (type != 3) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x485,
             "ref_mpi_blindsend",6,"data type");
      return 6;
    }
    if (ldim * a_data._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x47b,
             "ref_mpi_blindsend","malloc a_data of REF_DBL negative");
      return 1;
    }
    _ref_malloc_init_i = malloc((long)(ldim * a_data._4_4_) << 3);
    if (_ref_malloc_init_i == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x47b,
             "ref_mpi_blindsend","malloc a_data of REF_DBL NULL");
      return 2;
    }
    if (ldim * (int)a_data < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x47c,
             "ref_mpi_blindsend","malloc *((REF_DBL **)recv) of REF_DBL negative");
      return 1;
    }
    pvVar2 = malloc((long)(ldim * (int)a_data) << 3);
    *recv = pvVar2;
    if (*recv == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x47c,
             "ref_mpi_blindsend","malloc *((REF_DBL **)recv) of REF_DBL NULL");
      return 2;
    }
    for (part = 0; part < nsend; part = part + 1) {
      for (local_40 = 0; local_40 < ldim; local_40 = local_40 + 1) {
        *(undefined8 *)((long)_ref_malloc_init_i + (long)(local_40 + ldim * __ptr[proc[part]]) * 8)
             = *(undefined8 *)((long)send + (long)(local_40 + ldim * part) * 8);
      }
      __ptr[proc[part]] = __ptr[proc[part]] + 1;
    }
  }
  uVar1 = ref_mpi_alltoallv(ref_mpi,_ref_malloc_init_i,send_size,*recv,recv_size,ldim,type);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x489,
           "ref_mpi_blindsend",(ulong)uVar1,"alltoallv global");
    return uVar1;
  }
  *nrecv = (int)a_data;
  if (__ptr != (undefined4 *)0x0) {
    free(__ptr);
  }
  if (_ref_malloc_init_i != (void *)0x0) {
    free(_ref_malloc_init_i);
  }
  if (recv_size != (REF_INT *)0x0) {
    free(recv_size);
  }
  if (send_size != (REF_INT *)0x0) {
    free(send_size);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_blindsend(REF_MPI ref_mpi, REF_INT *proc, void *send,
                                     REF_INT ldim, REF_INT nsend, void **recv,
                                     REF_INT *nrecv, REF_TYPE type) {
  REF_INT i, l, part;
  REF_INT *a_size, *b_size;
  REF_INT *a_next;
  REF_INT a_total, b_total;

  void *a_data;

  a_data = NULL;
  *recv = NULL;

  if (!ref_mpi_para(ref_mpi)) {
    *nrecv = nsend;
    switch (type) {
      case REF_INT_TYPE:
        ref_malloc(*((REF_INT **)recv), ldim * nsend, REF_INT);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_INT **)recv))[i] = ((REF_INT *)send)[i];
        }
        break;
      case REF_LONG_TYPE:
        ref_malloc(*((REF_LONG **)recv), ldim * nsend, REF_LONG);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_LONG **)recv))[i] = ((REF_LONG *)send)[i];
        }
        break;
      case REF_DBL_TYPE:
        ref_malloc(*((REF_DBL **)recv), ldim * nsend, REF_DBL);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_DBL **)recv))[i] = ((REF_DBL *)send)[i];
        }
        break;
      default:
        RSS(REF_IMPLEMENT, "data type");
    }
    return REF_SUCCESS;
  }

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (i = 0; i < nsend; i++) a_size[proc[i]]++;

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  a_data = NULL;
  *recv = NULL;
  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_INT);
      ref_malloc(*((REF_INT **)recv), ldim * b_total, REF_INT);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_INT *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_INT *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    case REF_LONG_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_LONG);
      ref_malloc(*((REF_LONG **)recv), ldim * b_total, REF_LONG);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_LONG *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_LONG *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    case REF_DBL_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_DBL);
      ref_malloc(*((REF_DBL **)recv), ldim * b_total, REF_DBL);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_DBL *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_DBL *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_data, a_size, *recv, b_size, ldim, type),
      "alltoallv global");

  *nrecv = b_total;

  ref_free(a_next);
  ref_free(a_data);
  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}